

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O1

bool __thiscall GenericModel::setFlags(GenericModel *this,QModelIndex *index,ItemFlags flags)

{
  GenericModelItem **ppGVar1;
  GenericModelItem **ppGVar2;
  bool bVar3;
  bool bVar4;
  
  bVar4 = (index->c | index->r) < 0;
  if (bVar4) {
    bVar3 = false;
  }
  else {
    bVar3 = index->m != (QAbstractItemModel *)0x0;
  }
  if (bVar3 != false) {
    ppGVar1 = &this->m_dptr->root;
    ppGVar2 = (GenericModelItem **)&index->i;
    if (index->m == (QAbstractItemModel *)0x0) {
      ppGVar2 = ppGVar1;
    }
    if (bVar4) {
      ppGVar2 = ppGVar1;
    }
    if (((*ppGVar2)->flags).i != flags.i) {
      ((*ppGVar2)->flags).i = flags.i;
      QAbstractItemModel::dataChanged((QModelIndex *)this,index,(QList *)index);
    }
  }
  return bVar3;
}

Assistant:

bool GenericModel::setFlags(const QModelIndex &index, Qt::ItemFlags flags)
{
    if (!index.isValid())
        return false;
    Q_ASSERT(index.model() == this);
    Q_D(GenericModel);
    GenericModelItem *const item = d->itemForIndex(index);
    if (item->flags != flags) {
        item->flags = flags;
        dataChanged(index, index);
    }
    return true;
}